

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

bool __thiscall
CKey::Sign(CKey *this,uint256 *hash,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,
          bool grind,uint32_t test_case)

{
  bool bVar1;
  int iVar2;
  uchar *output;
  secp256k1_context *ctx;
  undefined1 in_CL;
  secp256k1_ecdsa_signature *in_RDX;
  secp256k1_context *in_RSI;
  secp256k1_pubkey *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int ret;
  uint32_t counter;
  size_t nSigLen;
  secp256k1_pubkey pk;
  secp256k1_ecdsa_signature sig;
  uchar extra_entropy [32];
  undefined4 in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  uchar *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffed0;
  secp256k1_context *in_stack_fffffffffffffed8;
  byte local_111;
  secp256k1_ecdsa_signature *sig_00;
  secp256k1_context *outputlen;
  code *noncedata;
  undefined4 in_stack_ffffffffffffff20;
  int iVar3;
  undefined3 in_stack_ffffffffffffff2c;
  uint uVar4;
  secp256k1_pubkey *pubkey;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  secp256k1_pubkey *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffff80;
  secp256k1_context *in_stack_ffffffffffffff88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = CONCAT13(in_CL,in_stack_ffffffffffffff2c) & 0x1ffffff;
  pubkey = in_RDI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0);
    memset(&stack0xffffffffffffffd8,0,0x20);
    WriteLE32(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    iVar3 = 0;
    outputlen = secp256k1_context_sign;
    output = base_blob<256U>::begin
                       ((base_blob<256U> *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    begin((CKey *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    ctx = (secp256k1_context *)
          UCharCast((byte *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    noncedata = nonce_function_rfc6979;
    if (((uVar4 & 0x1000000) == 0) && (in_R8D != 0)) {
      sig_00 = (secp256k1_ecdsa_signature *)&stack0xffffffffffffffd8;
    }
    else {
      sig_00 = (secp256k1_ecdsa_signature *)0x0;
    }
    iVar2 = secp256k1_ecdsa_sign
                      (in_RSI,in_RDX,(uchar *)CONCAT44(uVar4,in_R8D),
                       (uchar *)CONCAT44(iVar3,in_stack_ffffffffffffff20),
                       (secp256k1_nonce_function)in_RDI,nonce_function_rfc6979);
    while( true ) {
      local_111 = 0;
      if (iVar2 != 0) {
        bVar1 = SigHasLowR((secp256k1_ecdsa_signature *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_111 = 0;
        if (!bVar1) {
          local_111 = (byte)(uVar4 >> 0x18);
        }
      }
      if ((local_111 & 1) == 0) break;
      iVar3 = iVar3 + 1;
      WriteLE32(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      in_stack_fffffffffffffed8 = secp256k1_context_sign;
      base_blob<256U>::begin
                ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      begin((CKey *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      UCharCast((byte *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      iVar2 = secp256k1_ecdsa_sign
                        (in_RSI,in_RDX,(uchar *)CONCAT44(uVar4,in_R8D),
                         (uchar *)CONCAT44(iVar3,iVar2),(secp256k1_nonce_function)in_RDI,noncedata);
    }
    if (iVar2 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0xe0,
                    "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
                   );
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    secp256k1_ecdsa_signature_serialize_der(ctx,output,(size_t *)outputlen,sig_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0);
    begin((CKey *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    UCharCast((byte *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    iVar3 = secp256k1_ec_pubkey_create
                      ((secp256k1_context *)
                       CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),pubkey,
                       (uchar *)in_RSI);
    if (iVar3 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0xe6,
                    "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
                   );
    }
    base_blob<256U>::begin
              ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    iVar3 = secp256k1_ecdsa_verify
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff70);
    if (iVar3 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0xe8,
                    "bool CKey::Sign(const uint256 &, std::vector<unsigned char> &, bool, uint32_t) const"
                   );
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::Sign(const uint256 &hash, std::vector<unsigned char>& vchSig, bool grind, uint32_t test_case) const {
    if (!keydata)
        return false;
    vchSig.resize(CPubKey::SIGNATURE_SIZE);
    size_t nSigLen = CPubKey::SIGNATURE_SIZE;
    unsigned char extra_entropy[32] = {0};
    WriteLE32(extra_entropy, test_case);
    secp256k1_ecdsa_signature sig;
    uint32_t counter = 0;
    int ret = secp256k1_ecdsa_sign(secp256k1_context_sign, &sig, hash.begin(), UCharCast(begin()), secp256k1_nonce_function_rfc6979, (!grind && test_case) ? extra_entropy : nullptr);

    // Grind for low R
    while (ret && !SigHasLowR(&sig) && grind) {
        WriteLE32(extra_entropy, ++counter);
        ret = secp256k1_ecdsa_sign(secp256k1_context_sign, &sig, hash.begin(), UCharCast(begin()), secp256k1_nonce_function_rfc6979, extra_entropy);
    }
    assert(ret);
    secp256k1_ecdsa_signature_serialize_der(secp256k1_context_sign, vchSig.data(), &nSigLen, &sig);
    vchSig.resize(nSigLen);
    // Additional verification step to prevent using a potentially corrupted signature
    secp256k1_pubkey pk;
    ret = secp256k1_ec_pubkey_create(secp256k1_context_sign, &pk, UCharCast(begin()));
    assert(ret);
    ret = secp256k1_ecdsa_verify(secp256k1_context_static, &sig, hash.begin(), &pk);
    assert(ret);
    return true;
}